

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

mg_connection *
mg_connect_client_impl
          (mg_client_options *client_options,int use_ssl,mg_init_data *init,mg_error_data *error)

{
  mg_context *src;
  socklen_t __len;
  ushort uVar1;
  int iVar2;
  int iVar3;
  socklen_t sock;
  int iVar4;
  int iVar5;
  mg_connection *conn;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  uint line;
  char **ppcVar10;
  mg_context *ctx;
  char *func;
  mg_context *ctx_00;
  char *fmt;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar11;
  int local_74;
  int local_70;
  socklen_t len_1;
  usa sa;
  char *local_48;
  undefined4 local_3c;
  socklen_t len;
  short local_34;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  conn = (mg_connection *)calloc(1,0x2cf90);
  if (init == (mg_init_data *)0x0) {
    if (conn == (mg_connection *)0x0) {
      return (mg_connection *)0x0;
    }
  }
  else {
    init->callbacks = (mg_callbacks *)0x0;
    if (init->configuration_options != (char **)0x0) {
      *(undefined1 *)init->user_data = 0;
    }
    if (conn == (mg_connection *)0x0) {
      init->callbacks = (mg_callbacks *)0x2cf9000000006;
      pcVar8 = (char *)init->user_data;
      ppcVar10 = init->configuration_options;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar10,"calloc(): %s",pcVar7);
      return (mg_connection *)0x0;
    }
  }
  conn->phys_ctx = (mg_context *)(conn + 1);
  conn->buf = (char *)&conn[0x42].request_info.http_headers[0x11].value;
  conn->buf_size = 0x4000;
  conn[1].connection_type = 2;
  conn->dom_ctx = (mg_domain_context *)&conn[0x41].last_throttle_time;
  src = (mg_context *)client_options->host;
  iVar5 = client_options->port;
  sa._0_8_ = 0;
  sa._8_4_ = 0;
  sa._12_4_ = 0;
  sa._16_4_ = 0;
  sa._20_8_ = 0;
  local_70 = use_ssl;
  if (src == (mg_context *)0x0) {
    if (init == (mg_init_data *)0x0) goto LAB_0011ebec;
    *(undefined4 *)&init->callbacks = 1;
    pcVar8 = (char *)init->user_data;
    ppcVar10 = init->configuration_options;
    pcVar7 = "NULL host";
LAB_0011e869:
    fmt = "%s";
  }
  else {
    if (iVar5 - 0x10000U < 0xffff0001) {
      if (init == (mg_init_data *)0x0) goto LAB_0011ebec;
      *(undefined4 *)&init->callbacks = 1;
      pcVar8 = (char *)init->user_data;
      ppcVar10 = init->configuration_options;
      pcVar7 = "invalid port";
      goto LAB_0011e869;
    }
    line = 0x10;
    iVar4 = 2;
    iVar2 = mg_inet_pton(2,(char *)src,&sa,0x10,1);
    uVar1 = (ushort)iVar5;
    if (iVar2 == 0) {
      line = 0x1c;
      iVar4 = 10;
      ctx_00 = src;
      iVar3 = mg_inet_pton(10,(char *)src,&sa,0x1c,1);
      if (iVar3 != 0) goto LAB_0011e8bf;
      if ((char)src->context_type != '[') {
LAB_0011ec12:
        if (init == (mg_init_data *)0x0) goto LAB_0011ebec;
        *(undefined4 *)&init->callbacks = 0xf;
        pcVar8 = (char *)init->user_data;
        ppcVar10 = init->configuration_options;
        pcVar7 = "host not found";
        goto LAB_0011e869;
      }
      pcVar8 = (char *)((long)&src->context_type + 1);
      sVar9 = strlen(pcVar8);
      if ((sVar9 < 2) || (pcVar8 = mg_strdup_ctx(pcVar8,ctx_00), pcVar8 == (char *)0x0))
      goto LAB_0011ec12;
      pcVar8[sVar9 - 1] = '\0';
      line = 0x1c;
      iVar4 = 10;
      local_48 = pcVar8;
      iVar3 = mg_inet_pton(10,pcVar8,&sa,0x1c,0);
      if (iVar3 == 0) {
        free(local_48);
        goto LAB_0011ec12;
      }
      sa.sin.sin_port = uVar1 << 8 | uVar1 >> 8;
      free(local_48);
    }
    else {
LAB_0011e8bf:
      sa.sin.sin_port = uVar1 << 8 | uVar1 >> 8;
    }
    sock = socket(iVar4,1,0);
    if (sock != 0xffffffff) {
      iVar4 = set_non_blocking_mode(sock);
      if (iVar4 == 0) {
        set_close_on_exec(sock,conn + 1,ctx);
        __len = 0x10;
        if (iVar2 == 0) {
          __len = 0x1c;
        }
        iVar2 = connect(sock,(sockaddr *)&sa.sa,__len);
        if (iVar2 == 0) {
LAB_0011ea2a:
          len = 0x1c;
          if (sa.sa.sa_family == 2) {
            len = 0x10;
          }
          (conn->client).sock = sock;
          *(undefined8 *)&(conn->client).lsa = sa._0_8_;
          *(ulong *)((long)&(conn->client).lsa + 8) = CONCAT44(sa._12_4_,sa._8_4_);
          *(ulong *)((long)&(conn->client).lsa + 0xc) = CONCAT44(sa._16_4_,sa._12_4_);
          *(undefined8 *)((long)&(conn->client).lsa + 0x14) = sa._20_8_;
          iVar5 = getsockname(sock,(sockaddr *)&(conn->client).rsa.sa,&len);
          if (iVar5 != 0) {
            piVar6 = __errno_location();
            pcVar8 = strerror(*piVar6);
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,func,line,"%s: getsockname() failed: %s",
                       "mg_connect_client_impl",pcVar8);
          }
          (conn->client).is_ssl = local_70 != 0;
          iVar5 = pthread_mutex_init((pthread_mutex_t *)&conn->mutex,
                                     (pthread_mutexattr_t *)&pthread_mutex_attr);
          if (iVar5 == 0) {
            return conn;
          }
          if (init != (mg_init_data *)0x0) {
            *(undefined4 *)&init->callbacks = 9;
            piVar6 = __errno_location();
            *(int *)((long)&init->callbacks + 4) = *piVar6;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)init->user_data,
                        (size_t)init->configuration_options,"Can not create mutex");
          }
        }
        else {
          piVar6 = __errno_location();
          local_74 = *piVar6;
          if (local_74 == 0x73) {
            len_1 = 4;
            local_3c = 0;
            local_34 = 4;
            len = sock;
            iVar2 = mg_poll((pollfd *)&len,1,10000,(stop_flag_t *)&conn[1].request_info.local_uri);
            if (iVar2 == 1) {
              iVar2 = getsockopt(sock,1,4,&local_74,&len_1);
              line = (uint)&local_74;
              if (iVar2 == 0 && local_74 == 0) goto LAB_0011ea2a;
              goto LAB_0011eb7c;
            }
            if (init == (mg_init_data *)0x0) goto LAB_0011ebe7;
            *(undefined4 *)&init->callbacks = 0x10;
            pcVar8 = (char *)init->user_data;
            ppcVar10 = init->configuration_options;
            pcVar7 = "connect(%s:%d): timeout";
          }
          else {
LAB_0011eb7c:
            if (init == (mg_init_data *)0x0) goto LAB_0011ebe7;
            *(undefined4 *)&init->callbacks = 0x11;
            *(int *)((long)&init->callbacks + 4) = *piVar6;
            pcVar8 = (char *)init->user_data;
            ppcVar10 = init->configuration_options;
            strerror(local_74);
            pcVar7 = "connect(%s:%d): error %s";
          }
          mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar10,pcVar7,src,
                      CONCAT44(uVar11,iVar5));
        }
      }
      else if (init != (mg_init_data *)0x0) {
        *(undefined4 *)&init->callbacks = 9;
        piVar6 = __errno_location();
        iVar5 = *piVar6;
        *(int *)((long)&init->callbacks + 4) = iVar5;
        pcVar8 = (char *)init->user_data;
        ppcVar10 = init->configuration_options;
        pcVar7 = strerror(iVar5);
        mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar10,
                    "Cannot set socket to non-blocking: %s",pcVar7);
      }
LAB_0011ebe7:
      close(sock);
      goto LAB_0011ebec;
    }
    if (init == (mg_init_data *)0x0) goto LAB_0011ebec;
    *(undefined4 *)&init->callbacks = 9;
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    *(int *)((long)&init->callbacks + 4) = iVar5;
    pcVar8 = (char *)init->user_data;
    ppcVar10 = init->configuration_options;
    pcVar7 = strerror(iVar5);
    fmt = "socket(): %s";
  }
  mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar8,(size_t)ppcVar10,fmt,pcVar7);
LAB_0011ebec:
  free(conn);
  return (mg_connection *)0x0;
}

Assistant:

static struct mg_connection *
mg_connect_client_impl(const struct mg_client_options *client_options,
                       int use_ssl,
                       struct mg_init_data *init,
                       struct mg_error_data *error)
{
	struct mg_connection *conn = NULL;
	SOCKET sock;
	union usa sa;
	struct sockaddr *psa;
	socklen_t len;

	unsigned max_req_size =
	    (unsigned)atoi(config_options[MAX_REQUEST_SIZE].default_value);

	/* Size of structures, aligned to 8 bytes */
	size_t conn_size = ((sizeof(struct mg_connection) + 7) >> 3) << 3;
	size_t ctx_size = ((sizeof(struct mg_context) + 7) >> 3) << 3;
	size_t alloc_size = conn_size + ctx_size + max_req_size;

	(void)init; /* TODO: Implement required options */

	conn = (struct mg_connection *)mg_calloc(1, alloc_size);

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			error->text[0] = 0;
		}
	}

	if (conn == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)alloc_size;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "calloc(): %s",
			            strerror(ERRNO));
		}
		return NULL;
	}

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wcast-align"
#endif /* defined(GCC_DIAGNOSTIC) */
	/* conn_size is aligned to 8 bytes */

	conn->phys_ctx = (struct mg_context *)(((char *)conn) + conn_size);

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

	conn->buf = (((char *)conn) + conn_size + ctx_size);
	conn->buf_size = (int)max_req_size;
	conn->phys_ctx->context_type = CONTEXT_HTTP_CLIENT;
	conn->dom_ctx = &(conn->phys_ctx->dd);

	if (!connect_socket(conn->phys_ctx,
	                    client_options->host,
	                    client_options->port,
	                    use_ssl,
	                    error,
	                    &sock,
	                    &sa)) {
		/* "error" will be set by connect_socket. */
		/* free all memory and return NULL; */
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
#if (defined(OPENSSL_API_1_1) || defined(OPENSSL_API_3_0))                     \
    && !defined(NO_SSL_DL)

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(TLS_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#else

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(SSLv23_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#endif /* OPENSSL_API_1_1 || OPENSSL_API_3_0 */
#endif /* NO_SSL */

#if defined(USE_IPV6)
	len = (sa.sa.sa_family == AF_INET) ? sizeof(conn->client.rsa.sin)
	                                   : sizeof(conn->client.rsa.sin6);
	psa = (sa.sa.sa_family == AF_INET)
	          ? (struct sockaddr *)&(conn->client.rsa.sin)
	          : (struct sockaddr *)&(conn->client.rsa.sin6);
#else
	len = sizeof(conn->client.rsa.sin);
	psa = (struct sockaddr *)&(conn->client.rsa.sin);
#endif

	conn->client.sock = sock;
	conn->client.lsa = sa;

	if (getsockname(sock, psa, &len) != 0) {
		mg_cry_internal(conn,
		                "%s: getsockname() failed: %s",
		                __func__,
		                strerror(ERRNO));
	}

	conn->client.is_ssl = use_ssl ? 1 : 0;
	if (0 != pthread_mutex_init(&conn->mutex, &pthread_mutex_attr)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "Can not create mutex");
		}
#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
		SSL_CTX_free(conn->dom_ctx->ssl_ctx);
#endif
		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
	if (use_ssl) {
		/* TODO: Check ssl_verify_peer and ssl_ca_path here.
		 * SSL_CTX_set_verify call is needed to switch off server
		 * certificate checking, which is off by default in OpenSSL and
		 * on in yaSSL. */
		/* TODO: SSL_CTX_set_verify(conn->dom_ctx,
		 * SSL_VERIFY_PEER, verify_ssl_server); */

		if (client_options->client_cert) {
			if (!ssl_use_pem_file(conn->phys_ctx,
			                      conn->dom_ctx,
			                      client_options->client_cert,
			                      NULL)) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_CLIENT_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "Can not use SSL client certificate");
				}

				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
		}

		if (client_options->server_cert) {
			if (SSL_CTX_load_verify_locations(conn->dom_ctx->ssl_ctx,
			                                  client_options->server_cert,
			                                  NULL)
			    != 1) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_SERVER_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "SSL_CTX_load_verify_locations error: %s",
					            ssl_error());
				}
				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_PEER, NULL);
		} else {
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_NONE, NULL);
		}

		if (!sslize(conn, SSL_connect, client_options)) {
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_TLS_CONNECT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for ebuf */
				            error->text,
				            error->text_buffer_size,
				            "SSL connection error");
			}
			SSL_CTX_free(conn->dom_ctx->ssl_ctx);
			closesocket(sock);
			mg_free(conn);
			return NULL;
		}
	}
#endif

	return conn;
}